

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

ostream * anon_unknown.dwarf_e668::operator<<(ostream *os,PrettyTime *rhs)

{
  ostream *poVar1;
  ulong uVar2;
  
  uVar2 = (rhs->mTime).__r;
  if ((long)uVar2 < 0) {
    std::operator<<(os,'-');
    uVar2 = -uVar2;
  }
  if (uVar2 < 0xe10) {
    poVar1 = std::ostream::_M_insert<long>((long)os);
    poVar1 = std::operator<<(poVar1,'m');
    std::operator<<(poVar1,0x30);
  }
  else {
    poVar1 = std::ostream::_M_insert<long>((long)os);
    poVar1 = std::operator<<(poVar1,'h');
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(poVar1,'m');
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<long>((long)os);
  poVar1 = std::operator<<(poVar1,'s');
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0;
  std::operator<<(poVar1,0x20);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const PrettyTime &rhs)
{
    using hours = std::chrono::hours;
    using minutes = std::chrono::minutes;

    seconds t{rhs.mTime};
    if(t.count() < 0)
    {
        os << '-';
        t *= -1;
    }

    // Only handle up to hour formatting
    if(t >= hours{1})
        os << duration_cast<hours>(t).count() << 'h' << std::setfill('0') << std::setw(2)
           << (duration_cast<minutes>(t).count() % 60) << 'm';
    else
        os << duration_cast<minutes>(t).count() << 'm' << std::setfill('0');
    os << std::setw(2) << (duration_cast<seconds>(t).count() % 60) << 's' << std::setw(0)
       << std::setfill(' ');
    return os;
}